

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

void __thiscall
phosg::Image::Image(Image *this,size_t x,size_t y,bool has_alpha,uint8_t channel_width)

{
  uint64_t uVar1;
  size_t __size;
  void *pvVar2;
  size_t num_bytes;
  uint8_t channel_width_local;
  bool has_alpha_local;
  size_t y_local;
  size_t x_local;
  Image *this_local;
  
  this->width = x;
  this->height = y;
  this->has_alpha = has_alpha;
  this->channel_width = channel_width;
  uVar1 = mask_for_width(this->channel_width);
  this->max_value = uVar1;
  __size = get_data_size(this);
  pvVar2 = malloc(__size);
  (this->data).raw = pvVar2;
  memset((this->data).raw,0,__size);
  return;
}

Assistant:

Image::Image(size_t x, size_t y, bool has_alpha, uint8_t channel_width)
    : width(x),
      height(y),
      has_alpha(has_alpha),
      channel_width(channel_width),
      max_value(mask_for_width(this->channel_width)) {
  size_t num_bytes = this->get_data_size();
  this->data.raw = malloc(num_bytes);
  memset(this->data.raw, 0, num_bytes * sizeof(uint8_t));
}